

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  size_t capacity;
  slot_type *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  element_type *peVar4;
  size_t i;
  slot_type *psVar5;
  size_t sVar6;
  FindInfo FVar7;
  Layout LVar8;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar5 = this->slots_;
    capacity = this->capacity_;
    this->capacity_ = new_capacity;
    initialize_slots(this);
    if (capacity != 0) {
      sVar6 = 0;
      do {
        if (-1 < p[sVar6]) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (psVar5->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
          hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,8) +
                    SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,0);
          FVar7 = find_first_non_full(this,hashval);
          i = FVar7.offset;
          set_ctrl(this,i,(byte)hashval & 0x7f);
          psVar1 = this->slots_;
          psVar1[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          peVar4 = (psVar5->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var2 = (psVar5->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          (psVar5->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          psVar1 = psVar1 + i;
          (psVar1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
          (psVar1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
               = p_Var2;
          (psVar5->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)0x0;
          p_Var2 = (psVar5->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
        }
        sVar6 = sVar6 + 1;
        psVar5 = psVar5 + 1;
      } while (capacity != sVar6);
      LVar8 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::shared_ptr<vmips::VirtReg>>>
                ((allocator<std::shared_ptr<vmips::VirtReg>_> *)&this->settings_,p,
                 LVar8.
                 super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.
                 size_[1] * 0x10 +
                 (LVar8.
                  super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.
                  size_[0] + 7 & 0xfffffffffffffff8));
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x750,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Hash, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::shared_ptr<vmips::VirtReg>>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, Hash = phmap::priv::HashEq<vmips::VirtReg *>::Hash, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::shared_ptr<vmips::VirtReg>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }